

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

String * __thiscall
glcts::LayoutBindingBaseCase::initDefaultVSContext_abi_cxx11_
          (String *__return_storage_ptr__,LayoutBindingBaseCase *this)

{
  bool bVar1;
  int iVar2;
  mapped_type *ppcVar3;
  mapped_type *this_00;
  char *pcVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  mapped_type *pmVar6;
  undefined4 extraout_var_00;
  allocator<char> local_35d;
  key_type local_35c;
  string local_358;
  StringTemplate local_338;
  allocator<char> local_311;
  key_type local_310;
  allocator<char> local_2e9;
  key_type local_2e8;
  allocator<char> local_2c1;
  key_type local_2c0;
  allocator<char> local_299;
  key_type local_298;
  allocator<char> local_271;
  key_type local_270;
  allocator<char> local_249;
  key_type local_248;
  allocator<char> local_221;
  key_type local_220;
  allocator<char> local_1f9;
  key_type local_1f8;
  string local_1d8 [48];
  undefined1 local_1a8 [8];
  StringStream s;
  StringMap *args;
  LayoutBindingBaseCase *local_18;
  LayoutBindingBaseCase *this_local;
  
  args._4_4_ = 0;
  local_18 = this;
  this_local = (LayoutBindingBaseCase *)__return_storage_ptr__;
  ppcVar3 = std::
            map<glcts::eStageType,_const_char_*,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_const_char_*>_>_>
            ::operator[](&this->m_templates,(key_type *)((long)&args + 4));
  *ppcVar3 = 
  "${VERSION}layout(location=0) in vec2 inPosition;\n${UNIFORM_DECL}\nflat out ${OUT_VAR_TYPE} fragColor;\n${OPTIONAL_FUNCTION_BLOCK}\nvoid main(void)\n{\n  ${OUT_ASSIGNMENT} ${UNIFORM_ACCESS}\n  gl_Position = vec4(inPosition, 0.0, 1.0);\n}\n"
  ;
  s.super_ostringstream._372_4_ = 0;
  this_00 = std::
            map<glcts::eStageType,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ::operator[](&this->m_templateParams,(key_type *)&s.super_ostringstream.field_0x174);
  StringStream::StringStream((StringStream *)local_1a8);
  pcVar4 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
  poVar5 = std::operator<<((ostream *)local_1a8,pcVar4);
  std::operator<<(poVar5,"\n");
  std::operator<<((ostream *)local_1a8,"precision highp float;\n");
  bVar1 = needsPrecision(this);
  if (bVar1) {
    poVar5 = std::operator<<((ostream *)local_1a8,"precision highp ");
    iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
    poVar5 = std::operator<<(poVar5,*(char **)(CONCAT44(extraout_var,iVar2) + 0x18));
    std::operator<<(poVar5,";\n");
  }
  std::__cxx11::ostringstream::str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"VERSION",&local_1f9);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1f8);
  std::__cxx11::string::operator=((string *)pmVar6,local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"UNIFORM_DECL",&local_221)
  ;
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_220);
  std::__cxx11::string::operator=((string *)pmVar6,"");
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"OPTIONAL_FUNCTION_BLOCK",&local_249);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_248);
  std::__cxx11::string::operator=((string *)pmVar6,"");
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"UNIFORM_ACCESS",&local_271);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_270);
  std::__cxx11::string::operator=((string *)pmVar6,"");
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"OUT_ASSIGNMENT",&local_299);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_298);
  std::__cxx11::string::operator=((string *)pmVar6,"fragColor =");
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
  pcVar4 = *(char **)(CONCAT44(extraout_var_00,iVar2) + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"OUT_VAR_TYPE",&local_2c1)
  ;
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_2c0);
  std::__cxx11::string::operator=((string *)pmVar6,pcVar4);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"OUT_VAR",&local_2e9);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_2e8);
  std::__cxx11::string::operator=((string *)pmVar6,"fragColor");
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  if ((this->m_stage).type != VertexShader) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_310,"OUT_ASSIGNMENT",&local_311);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_310);
    std::__cxx11::string::operator=((string *)pmVar6,"");
    std::__cxx11::string::~string((string *)&local_310);
    std::allocator<char>::~allocator(&local_311);
  }
  local_35c = VertexShader;
  ppcVar3 = std::
            map<glcts::eStageType,_const_char_*,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_const_char_*>_>_>
            ::operator[](&this->m_templates,&local_35c);
  pcVar4 = *ppcVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,pcVar4,&local_35d);
  tcu::StringTemplate::StringTemplate(&local_338,&local_358);
  tcu::StringTemplate::specialize(__return_storage_ptr__,&local_338,this_00);
  tcu::StringTemplate::~StringTemplate(&local_338);
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator(&local_35d);
  StringStream::~StringStream((StringStream *)local_1a8);
  return __return_storage_ptr__;
}

Assistant:

String initDefaultVSContext()
	{
		m_templates[VertexShader] = "${VERSION}"
									"layout(location=0) in vec2 inPosition;\n"
									"${UNIFORM_DECL}\n"
									"flat out ${OUT_VAR_TYPE} fragColor;\n"
									"${OPTIONAL_FUNCTION_BLOCK}\n"
									"void main(void)\n"
									"{\n"
									"  ${OUT_ASSIGNMENT} ${UNIFORM_ACCESS}\n"
									"  gl_Position = vec4(inPosition, 0.0, 1.0);\n"
									"}\n";

		StringMap& args = m_templateParams[VertexShader];
		// some samplers and all images don't have default precision qualifier (sampler3D)
		// so append a precision default in all sampler and image cases.
		StringStream s;
		s << glu::getGLSLVersionDeclaration(m_glslVersion) << "\n";
		s << "precision highp float;\n";
		if (needsPrecision())
		{
			s << "precision highp " << getTestParameters().uniform_type << ";\n";
		}

		args["VERSION"]					= s.str();
		args["UNIFORM_DECL"]			= "";
		args["OPTIONAL_FUNCTION_BLOCK"] = "";
		args["UNIFORM_ACCESS"]			= "";
		args["OUT_ASSIGNMENT"]			= "fragColor =";
		args["OUT_VAR_TYPE"]			= getTestParameters().vector_type;
		args["OUT_VAR"]					= "fragColor";
		if (m_stage.type != VertexShader)
		{
			args["OUT_ASSIGNMENT"] = "";
		}
		return tcu::StringTemplate(m_templates[VertexShader]).specialize(args);
	}